

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeprovider.cpp
# Opt level: O1

Type * __thiscall stackjit::TypeProvider::makeType(TypeProvider *this,string *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  pointer pcVar3;
  bool bVar4;
  bool bVar5;
  undefined1 *puVar6;
  bool bVar7;
  int iVar8;
  const_iterator cVar9;
  mapped_type *ppTVar10;
  ClassType *this_00;
  Type *elementType;
  ClassMetadata *metadata;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  PrimitiveTypes primitiveType;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  typeParts;
  string className;
  __hashtable *__h;
  string elementTypeName;
  PrimitiveTypes local_14d;
  uint local_14c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  value_type local_130;
  ClassType *local_110;
  TypeProvider *local_108;
  ulong local_100;
  string *local_f8;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  string local_90;
  string local_70;
  string local_50;
  
  cVar9 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,name);
  if (cVar9.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    ppTVar10 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_stackjit::Type_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,name);
    return *ppTVar10;
  }
  local_b0 = local_a0;
  pcVar3 = (name->_M_dataplus)._M_p;
  local_108 = this;
  local_f8 = name;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar3,pcVar3 + name->_M_string_length);
  puVar6 = local_b0;
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_148.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_a8 != 0) {
    lVar13 = 0;
    bVar7 = false;
    do {
      cVar2 = puVar6[lVar13];
      bVar15 = bVar7;
      if (cVar2 == '[') {
        bVar15 = true;
      }
      bVar5 = bVar7;
      if (cVar2 == ']') {
        bVar5 = false;
      }
      bVar4 = !bVar7;
      bVar7 = bVar5;
      if (bVar4) {
        bVar7 = bVar15;
      }
      if ((cVar2 != '.') || (bVar7)) {
        std::__cxx11::string::push_back((char)&local_130);
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_148,&local_130);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_130,0,(char *)local_130._M_string_length,0x177146);
      }
      lVar13 = lVar13 + 1;
    } while (local_a8 != lVar13);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_148,&local_130);
  paVar1 = &local_130.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != paVar1) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
LAB_001752a5:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pcVar3 = ((local_148.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar3,
             pcVar3 + (local_148.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_string_length);
  bVar7 = TypeSystem::fromString(&local_50,&local_14d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (bVar7) {
    this_00 = (ClassType *)operator_new(0x28);
    PrimitiveType::PrimitiveType((PrimitiveType *)this_00,local_14d);
    goto LAB_00175243;
  }
  if (local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_148.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) goto LAB_001752a5;
  iVar8 = std::__cxx11::string::compare
                    ((char *)local_148.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
  if (iVar8 != 0) {
    this_00 = (ClassType *)0x0;
    goto LAB_00175243;
  }
  local_d0 = local_c0;
  local_c8 = 0;
  local_c0[0] = 0;
  if ((ulong)((long)local_148.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_148.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) {
LAB_001752c8:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",1);
  }
  local_f0 = local_e0;
  pcVar3 = local_148.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f0,pcVar3,
             pcVar3 + local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length);
  puVar6 = local_f0;
  local_130._M_string_length = 0;
  local_130.field_2._M_local_buf[0] = '\0';
  uVar11 = 0;
  uVar12 = uVar11;
  local_130._M_dataplus._M_p = (pointer)paVar1;
  if (local_e8 != 0) {
    lVar13 = 0;
    local_14c = 0;
    local_100 = 0;
    do {
      bVar7 = puVar6[lVar13] == ']';
      uVar11 = (uVar11 + (puVar6[lVar13] == '[')) - (uint)bVar7;
      if (!bVar7 || uVar11 != 0) {
        std::__cxx11::string::push_back((char)&local_130);
        iVar8 = std::__cxx11::string::compare((char *)&local_130);
        if ((iVar8 == 0) && ((local_100 & 1) == 0)) {
          local_130._M_string_length = 0;
          *local_130._M_dataplus._M_p = '\0';
          local_100 = CONCAT71((int7)((ulong)local_130._M_dataplus._M_p >> 8),1);
        }
      }
      else {
        local_14c = local_14c & 0xff;
        if ((local_100 & 1) != 0) {
          local_14c = 1;
        }
      }
      bVar15 = local_e8 + -1 != lVar13;
      lVar13 = lVar13 + 1;
      uVar12 = local_14c;
    } while ((!bVar7 || uVar11 != 0) && bVar15);
  }
  if ((uVar12 & 1) != 0) {
    std::__cxx11::string::_M_assign((string *)&local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if ((uVar12 & 1) == 0) {
    if ((ulong)((long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_148.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) < 2) goto LAB_001752c8;
    iVar8 = std::__cxx11::string::compare
                      ((char *)(local_148.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1));
    if (iVar8 == 0) {
      this_00 = (ClassType *)operator_new(0x28);
      NullReferenceType::NullReferenceType((NullReferenceType *)this_00);
    }
    else {
      if ((ulong)((long)local_148.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_148.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_001751fb;
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
      if (0x20 < (ulong)((long)local_148.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)local_148.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        bVar7 = true;
        uVar14 = 1;
        lVar13 = 0x28;
        do {
          if (bVar7) {
            bVar7 = false;
          }
          else {
            std::__cxx11::string::append((char *)&local_130);
          }
          if ((ulong)((long)local_148.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_148.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) <= uVar14) {
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar14);
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_130,
                     *(ulong *)((long)local_148.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar13 + -8));
          uVar14 = uVar14 + 1;
          lVar13 = lVar13 + 0x20;
        } while (uVar14 < (ulong)((long)local_148.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_148.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5));
      }
      bVar7 = ClassMetadataProvider::isDefined(local_108->mClassProvider,&local_130);
      if (bVar7) {
        this_00 = (ClassType *)operator_new(0x50);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_130._M_dataplus._M_p,
                   (char *)(local_130._M_string_length + (long)local_130._M_dataplus._M_p));
        metadata = ClassMetadataProvider::getMetadata(local_108->mClassProvider,&local_130);
        ClassType::ClassType(this_00,&local_90,metadata);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
      }
      else {
        this_00 = (ClassType *)0x0;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_d0,local_d0 + local_c8);
    elementType = makeType(local_108,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (elementType == (Type *)0x0) {
LAB_001751fb:
      this_00 = (ClassType *)0x0;
    }
    else {
      this_00 = (ClassType *)operator_new(0x30);
      ArrayType::ArrayType((ArrayType *)this_00,elementType);
    }
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
LAB_00175243:
  if (this_00 != (ClassType *)0x0) {
    pcVar3 = (local_f8->_M_dataplus)._M_p;
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar3,pcVar3 + local_f8->_M_string_length);
    local_110 = this_00;
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Type_const*>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Type_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string_const,stackjit::Type_const*>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,stackjit::Type_const*>,std::allocator<std::pair<std::__cxx11::string_const,stackjit::Type_const*>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)local_108);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_148);
  return (Type *)this_00;
}

Assistant:

const Type* TypeProvider::makeType(std::string name) {
		if (mTypes.count(name) > 0) {
			return mTypes[name];
		}

		//Split the type name
		auto typeParts = splitTypeName(name);
		Type* type = nullptr;

		PrimitiveTypes primitiveType;
		if (TypeSystem::fromString(typeParts.at(0), primitiveType)) {
			type = new PrimitiveType(primitiveType);
		} else if (typeParts.at(0) == "Ref") {
			std::string elementTypeName;
			if (extractElementType(typeParts.at(1), elementTypeName)) {
				auto elementType = makeType(elementTypeName);

				if (elementType != nullptr) {
					type = new ArrayType(elementType);
				}
			} else if (typeParts.at(1) == "Null") {
				type = new NullReferenceType();
			} else {
				if (typeParts.size() >= 2) {
					std::string className = "";
					bool isFirst = true;

					for (std::size_t i = 1; i < typeParts.size(); i++) {
						if (isFirst) {
							isFirst = false;
						} else {
							className += ".";
						}

						className += typeParts.at(i);
					}

					if (mClassProvider.isDefined(className)) {
						type = new ClassType(className, &mClassProvider.getMetadata(className));
					}
				}
			}
		}

		if (type != nullptr) {
			mTypes.insert({ name, type });
		}

		return type;
	}